

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,ByteData *parent_fingerprint,Pubkey *pubkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num,Bip32FormatType format_type)

{
  ByteData256 tweak_sum;
  uint32_t version;
  undefined8 in_stack_ffffffffffffff18;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  Extkey local_c0;
  
  version = ConvertToExtkeyVersion(network_type,format_type,false);
  ByteData256::ByteData256((ByteData256 *)&local_d8);
  tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff18;
  tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_d8;
  tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Extkey::FromPubkey(&local_c0,version,parent_fingerprint,pubkey,chain_code,depth,child_num,
                     tweak_sum);
  Extkey::Extkey(&this->super_Extkey,&local_c0);
  Extkey::~Extkey(&local_c0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const ByteData& parent_fingerprint,
    const Pubkey& pubkey, const ByteData256& chain_code, uint8_t depth,
    uint32_t child_num, Bip32FormatType format_type)
    : Extkey(Extkey::FromPubkey(
          ConvertToExtkeyVersion(network_type, format_type, false),
          parent_fingerprint, pubkey, chain_code, depth, child_num)) {}